

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O2

bool __thiscall llvm::DWARFDebugNames::ValueIterator::getEntryAtCurrentOffset(ValueIterator *this)

{
  storage_type *y;
  undefined1 local_e0 [8];
  Expected<llvm::DWARFDebugNames::Entry> EntryOr;
  
  NameIndex::getEntry((Expected<llvm::DWARFDebugNames::Entry> *)local_e0,this->CurrentIndex,
                      &this->DataOffset);
  if ((EntryOr.field_0.TStorage.buffer[0xb0] & 1U) == 0) {
    y = Expected<llvm::DWARFDebugNames::Entry>::getStorage
                  ((Expected<llvm::DWARFDebugNames::Entry> *)local_e0);
    optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry,_false>::operator=
              (&(this->CurrentEntry).Storage,y);
  }
  else {
    Expected<llvm::DWARFDebugNames::Entry>::takeError
              ((Expected<llvm::DWARFDebugNames::Entry> *)&EntryOr.field_0xb8);
    consumeError((Error *)&EntryOr.field_0xb8);
    if ((long *)(EntryOr._184_8_ & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(EntryOr._184_8_ & 0xfffffffffffffffe) + 8))();
    }
  }
  Expected<llvm::DWARFDebugNames::Entry>::~Expected
            ((Expected<llvm::DWARFDebugNames::Entry> *)local_e0);
  return (bool)(~EntryOr.field_0.TStorage.buffer[0xb0] & 1);
}

Assistant:

bool DWARFDebugNames::ValueIterator::getEntryAtCurrentOffset() {
  auto EntryOr = CurrentIndex->getEntry(&DataOffset);
  if (!EntryOr) {
    consumeError(EntryOr.takeError());
    return false;
  }
  CurrentEntry = std::move(*EntryOr);
  return true;
}